

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong *puVar13;
  byte bVar14;
  undefined1 *puVar15;
  ulong uVar16;
  int iVar17;
  byte *srcBuffer;
  int iVar18;
  undefined1 *puVar19;
  int iVar20;
  ulong uVar21;
  undefined1 *puVar22;
  int iVar23;
  undefined4 in_register_0000008c;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong *puVar29;
  ulong *puVar30;
  bool bVar31;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong *puStack_108;
  undefined1 *puStack_100;
  ulong *puStack_f8;
  BIT_DStream_t BStack_e8;
  ulong *puStack_c0;
  ulong *puStack_b8;
  undefined1 *puStack_b0;
  ulong *puStack_a8;
  ulong *puStack_a0;
  undefined1 *puStack_98;
  undefined1 *puStack_90;
  undefined1 *puStack_88;
  size_t sStack_80;
  size_t *psStack_68;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar11 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar11;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar11 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,maxDstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar11 != 0)) {
      return sVar11;
    }
    sVar11 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar11;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar21 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar12 = uVar21 + uVar5 + (ulong)uVar6 + 6;
  if (maxDstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar12) {
    return 0xffffffffffffffec;
  }
  puStack_90 = (undefined1 *)((long)dst + maxDstSize);
  uVar16 = maxDstSize + 3 >> 2;
  puStack_88 = (undefined1 *)(uVar16 + (long)dst);
  puStack_98 = puStack_88 + uVar16;
  puStack_b0 = puStack_98 + uVar16;
  if (puStack_90 < puStack_b0) {
    return 0xffffffffffffffec;
  }
  if (uVar4 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_c0 = (ulong *)((long)cSrc + 6);
  puStack_a8 = (ulong *)((long)cSrc + uVar21 + 6);
  uVar7 = *(undefined2 *)((long)DTable + 2);
  if (uVar4 < 8) {
    uStack_110 = (ulong)*(byte *)puStack_c0;
    switch(uVar4) {
    case 2:
      goto LAB_001919a5;
    case 3:
      goto LAB_0019199a;
    case 4:
      break;
    case 7:
      uStack_110 = uStack_110 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      break;
    default:
      goto switchD_00191957_default;
    }
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_0019199a:
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_001919a5:
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_00191957_default:
    bVar14 = *(byte *)((long)cSrc + uVar21 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_124 = (uVar25 ^ 0x1f) + (uint)uVar4 * -8 + 0x29;
    puStack_108 = puStack_c0;
  }
  else {
    bVar14 = *(byte *)((long)cSrc + uVar21 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_110 = *(ulong *)((long)cSrc + (uVar21 - 2));
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_124 = ~uVar25 + 9;
    puStack_108 = (ulong *)((long)cSrc + (uVar21 - 2));
  }
  if (uVar5 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_b8 = (ulong *)((ulong)uVar5 + (long)puStack_a8);
  if (uVar5 < 8) {
    uStack_120 = (ulong)(byte)*puStack_a8;
    switch(uVar5) {
    case 2:
      goto LAB_00191b03;
    case 3:
      goto LAB_00191af8;
    case 4:
      goto LAB_00191ae8;
    case 5:
      goto LAB_00191adc;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)cSrc + uVar21 + 0xc) << 0x30;
      break;
    default:
      goto switchD_00191a81_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar21 + 0xb) << 0x28);
LAB_00191adc:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar21 + 10) << 0x20);
LAB_00191ae8:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 9) * 0x1000000;
LAB_00191af8:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 8) * 0x10000;
LAB_00191b03:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar21 + 7) * 0x100;
switchD_00191a81_default:
    bVar14 = *(byte *)((long)puStack_b8 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_128 = (uVar25 ^ 0x1f) + (uint)uVar5 * -8 + 0x29;
    puStack_a0 = puStack_a8;
  }
  else {
    bVar14 = *(byte *)((long)puStack_b8 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    puStack_a0 = puStack_b8 + -1;
    uStack_120 = puStack_b8[-1];
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_128 = ~uVar25 + 9;
  }
  if (uVar6 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar6 + (long)puStack_b8);
  if (uVar6 < 8) {
    uStack_118 = (ulong)(byte)*puStack_b8;
    switch(uVar6) {
    case 2:
      goto LAB_00191c2f;
    case 3:
      goto LAB_00191c25;
    case 4:
      goto LAB_00191c1b;
    case 5:
      goto LAB_00191c10;
    case 6:
      break;
    case 7:
      uStack_118 = uStack_118 | (ulong)*(byte *)((long)puStack_b8 + 6) << 0x30;
      break;
    default:
      goto switchD_00191bd0_default;
    }
    uStack_118 = uStack_118 + ((ulong)*(byte *)((long)puStack_b8 + 5) << 0x28);
LAB_00191c10:
    uStack_118 = uStack_118 + ((ulong)*(byte *)((long)puStack_b8 + 4) << 0x20);
LAB_00191c1b:
    uStack_118 = uStack_118 + (ulong)*(byte *)((long)puStack_b8 + 3) * 0x1000000;
LAB_00191c25:
    uStack_118 = uStack_118 + (ulong)*(byte *)((long)puStack_b8 + 2) * 0x10000;
LAB_00191c2f:
    uStack_118 = uStack_118 + (ulong)*(byte *)((long)puStack_b8 + 1) * 0x100;
switchD_00191bd0_default:
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_12c = (uVar25 ^ 0x1f) + (uint)uVar6 * -8 + 0x29;
    puStack_f8 = puStack_b8;
  }
  else {
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_118 = *(ulong *)(srcBuffer + -8);
    uVar25 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uStack_12c = ~uVar25 + 9;
    puStack_f8 = (ulong *)(srcBuffer + -8);
  }
  sVar11 = BIT_initDStream(&BStack_e8,srcBuffer,cSrcSize - uVar12);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  puVar15 = (undefined1 *)((maxDstSize - 3) + (long)dst);
  puVar30 = (ulong *)((long)cSrc + 0xe);
  puVar29 = puStack_a8 + 1;
  puVar13 = puStack_b8 + 1;
  cVar9 = (char)uVar7;
  if (puStack_b0 < puVar15 && 7 < (ulong)((long)puStack_90 - (long)puStack_b0)) {
    sStack_80 = BStack_e8.bitContainer;
    bVar14 = -cVar9 & 0x3f;
    psStack_68 = (size_t *)BStack_e8.ptr;
    lVar8 = uVar16 * 3;
    do {
      puVar19 = (undefined1 *)dst;
      uVar12 = (uStack_110 << ((byte)uStack_124 & 0x3f)) >> bVar14;
      uVar21 = (uStack_120 << ((byte)uStack_128 & 0x3f)) >> bVar14;
      uVar24 = (uStack_118 << ((byte)uStack_12c & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uStack_124;
      uVar26 = (sStack_80 << ((byte)BStack_e8.bitsConsumed & 0x3f)) >> bVar14;
      uVar27 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *puVar19 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar18 = *(byte *)((long)DTable + uVar21 * 2 + 4) + uStack_128;
      puVar19[uVar16] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      iVar20 = *(byte *)((long)DTable + uVar24 * 2 + 4) + uStack_12c;
      puVar19[uVar16 * 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar26 * 2 + 4) + BStack_e8.bitsConsumed;
      puVar19[lVar8] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar12 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      uVar24 = (uStack_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar17;
      uVar26 = (sStack_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      uVar21 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar18 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
      puVar19[uVar16 + 1] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar20;
      puVar19[uVar16 * 2 + 1] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar19[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uVar21 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      uVar24 = (uStack_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      iVar18 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar18;
      uVar26 = (sStack_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      uVar12 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[uVar16 + 2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar20;
      puVar19[uVar16 * 2 + 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar19[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uStack_124 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      bVar1 = *(byte *)((long)DTable + uVar12 * 2 + 4);
      puVar19[uVar16 + 3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (uStack_118 << ((byte)iVar20 & 0x3f)) >> bVar14;
      bVar2 = *(byte *)((long)DTable + uVar12 * 2 + 4);
      puVar19[uVar16 * 2 + 3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (sStack_80 << ((byte)iVar23 & 0x3f)) >> bVar14;
      bVar3 = *(byte *)((long)DTable + uVar12 * 2 + 4);
      puVar19[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar17 = 3;
      if (puStack_108 < puVar30) {
        iVar10 = 3;
      }
      else {
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)(uStack_124 >> 3));
        uStack_124 = uStack_124 & 7;
        uStack_110 = *puStack_108;
        iVar10 = 0;
      }
      uStack_128 = iVar18 + (uint)bVar1;
      if (puVar29 <= puStack_a0) {
        puStack_a0 = (ulong *)((long)puStack_a0 - (ulong)(uStack_128 >> 3));
        uStack_128 = uStack_128 & 7;
        uStack_120 = *puStack_a0;
        iVar17 = 0;
      }
      uStack_12c = iVar20 + (uint)bVar2;
      iVar20 = 3;
      if (puStack_f8 < puVar13) {
        iVar18 = 3;
      }
      else {
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3));
        uStack_12c = uStack_12c & 7;
        uStack_118 = *puStack_f8;
        iVar18 = 0;
      }
      BStack_e8.bitsConsumed = iVar23 + (uint)bVar3;
      if (BStack_e8.limitPtr <= psStack_68) {
        psStack_68 = (size_t *)((long)psStack_68 - (ulong)(BStack_e8.bitsConsumed >> 3));
        BStack_e8.bitsConsumed = BStack_e8.bitsConsumed & 7;
        BStack_e8.bitContainer = *psStack_68;
        iVar20 = 0;
        sStack_80 = BStack_e8.bitContainer;
      }
    } while ((puVar19 + lVar8 + 4 < puVar15) &&
            (dst = puVar19 + 4, ((iVar17 == 0 && iVar10 == 0) && iVar18 == 0) && iVar20 == 0));
    dst = puVar19 + 4;
    BStack_e8.ptr = (char *)psStack_68;
    puStack_100 = (undefined1 *)((long)dst + lVar8);
    puVar19 = (undefined1 *)((long)dst + uVar16 * 2);
    puVar22 = (undefined1 *)((long)dst + uVar16);
  }
  else {
    puStack_100 = puStack_b0;
    puVar19 = puStack_98;
    puVar22 = puStack_88;
  }
  if ((puStack_88 < dst) || (puStack_98 < puVar22)) {
    return 0xffffffffffffffec;
  }
  if (puStack_b0 < puVar19) {
    return 0xffffffffffffffec;
  }
  uVar12 = (ulong)uStack_124;
  if ((long)puStack_88 - (long)dst < 4) {
    if (uStack_124 < 0x41) {
      if (puStack_108 < puVar30) {
        if (puStack_108 == puStack_c0) {
          puStack_108 = puStack_c0;
          goto LAB_00192343;
        }
        uVar25 = (int)puStack_108 - (int)puStack_c0;
        if (puStack_c0 <= (ulong *)((long)puStack_108 - (ulong)(uStack_124 >> 3))) {
          uVar25 = uStack_124 >> 3;
        }
        uStack_124 = uStack_124 + uVar25 * -8;
      }
      else {
        uVar25 = uStack_124 >> 3;
        uStack_124 = uStack_124 & 7;
      }
      uVar12 = (ulong)uStack_124;
      puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar25);
      uStack_110 = *puStack_108;
    }
  }
  else if (uStack_124 < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (puStack_108 < puVar30) {
        if (puStack_108 == puStack_c0) {
          puStack_108 = puStack_c0;
          break;
        }
        bVar31 = puStack_c0 <= (ulong *)((long)puStack_108 - (uVar12 >> 3));
        uVar25 = (int)puStack_108 - (int)puStack_c0;
        if (bVar31) {
          uVar25 = (uint)(uVar12 >> 3);
        }
        uVar28 = (uint)uVar12 + uVar25 * -8;
      }
      else {
        uVar25 = (uint)(uVar12 >> 3);
        uVar28 = (uint)uVar12 & 7;
        bVar31 = true;
      }
      uVar12 = (ulong)uVar28;
      puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar25);
      uStack_110 = *puStack_108;
      if ((puStack_88 + -3 <= dst) || (!bVar31)) break;
      uVar12 = (uStack_110 << ((byte)uVar28 & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uVar28;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      uVar21 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar16 = (uStack_110 << ((byte)iVar17 & 0x3f)) >> bVar14;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uVar25 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar17;
      uVar12 = (ulong)uVar25;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      dst = (void *)((long)dst + 4);
      if (0x40 < uVar25) break;
    } while( true );
  }
LAB_00192343:
  uVar25 = (uint)uVar12;
  if (dst < puStack_88) {
    do {
      uVar21 = (uStack_110 << ((byte)uVar12 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar25 = (int)uVar12 + (uint)*(byte *)((long)DTable + uVar21 * 2 + 4);
      uVar12 = (ulong)uVar25;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puStack_88);
  }
  puVar30 = puStack_a0;
  if ((long)puStack_98 - (long)puVar22 < 4) {
    if (uStack_128 < 0x41) {
      if (puStack_a0 < puVar29) {
        puVar30 = puStack_a8;
        if (puStack_a0 == puStack_a8) goto LAB_00192561;
        uVar28 = (int)puStack_a0 - (int)puStack_a8;
        if (puStack_a8 <= (ulong *)((long)puStack_a0 - (ulong)(uStack_128 >> 3))) {
          uVar28 = uStack_128 >> 3;
        }
        uStack_128 = uStack_128 + uVar28 * -8;
      }
      else {
        uVar28 = uStack_128 >> 3;
        uStack_128 = uStack_128 & 7;
      }
      puVar30 = (ulong *)((long)puStack_a0 - (ulong)uVar28);
      uStack_120 = *puVar30;
    }
  }
  else if (uStack_128 < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (puStack_a0 < puVar29) {
        puVar30 = puStack_a8;
        if (puStack_a0 == puStack_a8) break;
        bVar31 = puStack_a8 <= (ulong *)((long)puStack_a0 - (ulong)(uStack_128 >> 3));
        uVar28 = (int)puStack_a0 - (int)puStack_a8;
        if (bVar31) {
          uVar28 = uStack_128 >> 3;
        }
        uStack_128 = uStack_128 + uVar28 * -8;
      }
      else {
        uVar28 = uStack_128 >> 3;
        uStack_128 = uStack_128 & 7;
        bVar31 = true;
      }
      puVar30 = (ulong *)((long)puStack_a0 - (ulong)uVar28);
      uStack_120 = *puVar30;
      if ((puStack_98 + -3 <= puVar22) || (!bVar31)) break;
      uVar12 = (uStack_120 << ((byte)uStack_128 & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uStack_128;
      *puVar22 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (uStack_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      uVar21 = (uStack_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar12 = (uStack_120 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uStack_128 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puVar22[3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puVar22 = puVar22 + 4;
      puStack_a0 = puVar30;
      if (0x40 < uStack_128) break;
    } while( true );
  }
LAB_00192561:
  if (puVar22 < puStack_98) {
    do {
      uVar12 = (uStack_120 << ((byte)uStack_128 & 0x3f)) >> (-cVar9 & 0x3fU);
      uStack_128 = uStack_128 + *(byte *)((long)DTable + uVar12 * 2 + 4);
      *puVar22 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puVar22 = puVar22 + 1;
    } while (puVar22 < puStack_98);
  }
  puVar29 = puStack_f8;
  if ((long)puStack_b0 - (long)puVar19 < 4) {
    if (uStack_12c < 0x41) {
      if (puStack_f8 < puVar13) {
        puVar29 = puStack_b8;
        if (puStack_f8 == puStack_b8) goto LAB_0019275d;
        uVar28 = (int)puStack_f8 - (int)puStack_b8;
        if (puStack_b8 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3))) {
          uVar28 = uStack_12c >> 3;
        }
        uStack_12c = uStack_12c + uVar28 * -8;
      }
      else {
        uVar28 = uStack_12c >> 3;
        uStack_12c = uStack_12c & 7;
      }
      puVar29 = (ulong *)((long)puStack_f8 - (ulong)uVar28);
      uStack_118 = *puVar29;
    }
  }
  else if (uStack_12c < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (puStack_f8 < puVar13) {
        puVar29 = puStack_b8;
        if (puStack_f8 == puStack_b8) break;
        bVar31 = puStack_b8 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3));
        uVar28 = (int)puStack_f8 - (int)puStack_b8;
        if (bVar31) {
          uVar28 = uStack_12c >> 3;
        }
        uStack_12c = uStack_12c + uVar28 * -8;
      }
      else {
        uVar28 = uStack_12c >> 3;
        uStack_12c = uStack_12c & 7;
        bVar31 = true;
      }
      puVar29 = (ulong *)((long)puStack_f8 - (ulong)uVar28);
      uStack_118 = *puVar29;
      if ((puStack_b0 + -3 <= puVar19) || (!bVar31)) break;
      uVar12 = (uStack_118 << ((byte)uStack_12c & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uStack_12c;
      *puVar19 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (uStack_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      uVar21 = (uStack_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)DTable + uVar21 * 2 + 4) + iVar17;
      uVar12 = (uStack_118 << ((byte)iVar17 & 0x3f)) >> bVar14;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar21 * 2 + 5);
      uStack_12c = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puVar19 = puVar19 + 4;
      puStack_f8 = puVar29;
      if (0x40 < uStack_12c) break;
    } while( true );
  }
LAB_0019275d:
  if (puVar19 < puStack_b0) {
    do {
      uVar12 = (uStack_118 << ((byte)uStack_12c & 0x3f)) >> (-cVar9 & 0x3fU);
      uStack_12c = uStack_12c + *(byte *)((long)DTable + uVar12 * 2 + 4);
      *puVar19 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puVar19 = puVar19 + 1;
    } while (puVar19 < puStack_b0);
  }
  if ((long)puStack_90 - (long)puStack_100 < 4) {
    if (BStack_e8.bitsConsumed < 0x41) {
      if (BStack_e8.ptr < BStack_e8.limitPtr) {
        if (BStack_e8.ptr == BStack_e8.start) goto LAB_001929b6;
        uVar28 = (int)BStack_e8.ptr - (int)BStack_e8.start;
        if (BStack_e8.start <=
            (size_t *)((long)BStack_e8.ptr - (ulong)(BStack_e8.bitsConsumed >> 3))) {
          uVar28 = BStack_e8.bitsConsumed >> 3;
        }
        BStack_e8.bitsConsumed = BStack_e8.bitsConsumed + uVar28 * -8;
      }
      else {
        uVar28 = BStack_e8.bitsConsumed >> 3;
        BStack_e8.bitsConsumed = BStack_e8.bitsConsumed & 7;
      }
      BStack_e8.ptr = (char *)((long)BStack_e8.ptr - (ulong)uVar28);
      BStack_e8.bitContainer = *(size_t *)BStack_e8.ptr;
    }
  }
  else if (BStack_e8.bitsConsumed < 0x41) {
    bVar14 = -cVar9 & 0x3f;
    do {
      if (BStack_e8.ptr < BStack_e8.limitPtr) {
        if (BStack_e8.ptr == BStack_e8.start) break;
        bVar31 = BStack_e8.start <=
                 (size_t *)((long)BStack_e8.ptr - (ulong)(BStack_e8.bitsConsumed >> 3));
        uVar12 = (ulong)(uint)((int)BStack_e8.ptr - (int)BStack_e8.start);
        if (bVar31) {
          uVar12 = (ulong)(BStack_e8.bitsConsumed >> 3);
        }
        BStack_e8.bitsConsumed = BStack_e8.bitsConsumed + (int)uVar12 * -8;
      }
      else {
        uVar12 = (ulong)(BStack_e8.bitsConsumed >> 3);
        BStack_e8.bitsConsumed = BStack_e8.bitsConsumed & 7;
        bVar31 = true;
      }
      BStack_e8.ptr = (char *)((long)BStack_e8.ptr - uVar12);
      BStack_e8.bitContainer = *(size_t *)BStack_e8.ptr;
      if ((puVar15 <= puStack_100) || (!bVar31)) break;
      uVar12 = (BStack_e8.bitContainer << ((byte)BStack_e8.bitsConsumed & 0x3f)) >> bVar14;
      iVar17 = *(byte *)((long)DTable + uVar12 * 2 + 4) + BStack_e8.bitsConsumed;
      *puStack_100 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (BStack_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puStack_100[1] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (BStack_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      iVar17 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puStack_100[2] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      uVar12 = (BStack_e8.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar14;
      BStack_e8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar17;
      puStack_100[3] = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puStack_100 = puStack_100 + 4;
      if (0x40 < BStack_e8.bitsConsumed) break;
    } while( true );
  }
LAB_001929b6:
  if (puStack_100 < puStack_90) {
    do {
      uVar12 = (BStack_e8.bitContainer << ((byte)BStack_e8.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU)
      ;
      BStack_e8.bitsConsumed = *(byte *)((long)DTable + uVar12 * 2 + 4) + BStack_e8.bitsConsumed;
      *puStack_100 = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
      puStack_100 = puStack_100 + 1;
    } while (puStack_100 < puStack_90);
  }
  if (BStack_e8.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_e8.ptr != BStack_e8.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_12c != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar29 != puStack_b8) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_128 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar30 != puStack_a8) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar25 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_108 != puStack_c0) {
    return 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}